

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::TightenBoundsPS::execute
          (TightenBoundsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  pointer pnVar2;
  bool bVar3;
  VarStatus VVar4;
  int iVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar5 = this->m_j;
  VVar4 = cStatus->data[iVar5];
  if (VVar4 == ON_UPPER) {
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_438.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
    local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
    local_438.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
    local_438.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_438.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_438.m_backend.exp = pnVar2[iVar5].m_backend.exp;
    local_438.m_backend.neg = pnVar2[iVar5].m_backend.neg;
    local_438.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
    local_438.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
    local_478.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
    local_478.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
    local_478.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
    local_478.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
    local_478.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
    local_478.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
    local_478.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
    local_478.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
    local_478.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
    local_478.m_backend.exp = (this->m_origupper).m_backend.exp;
    local_478.m_backend.neg = (this->m_origupper).m_backend.neg;
    local_478.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
    local_478.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_180,this);
    bVar3 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_438,&local_478,&local_180);
LAB_002823ea:
    if (bVar3 == false) {
      return;
    }
  }
  else {
    if (VVar4 == ON_LOWER) {
      pnVar2 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3b8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
      local_3b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
      local_3b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
      puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
      local_3b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_3b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_3b8.m_backend.exp = pnVar2[iVar5].m_backend.exp;
      local_3b8.m_backend.neg = pnVar2[iVar5].m_backend.neg;
      local_3b8.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
      local_3b8.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
      local_3f8.m_backend.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
      local_3f8.m_backend.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
      local_3f8.m_backend.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
      local_3f8.m_backend.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
      local_3f8.m_backend.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
      local_3f8.m_backend.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
      local_3f8.m_backend.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
      local_3f8.m_backend.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
      local_3f8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
      local_3f8.m_backend.exp = (this->m_origlower).m_backend.exp;
      local_3f8.m_backend.neg = (this->m_origlower).m_backend.neg;
      local_3f8.m_backend.fpclass = (this->m_origlower).m_backend.fpclass;
      local_3f8.m_backend.prec_elem = (this->m_origlower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
      bVar3 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3b8,&local_3f8,&local_148);
      goto LAB_002823ea;
    }
    if (VVar4 != FIXED) {
      return;
    }
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
    local_1b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
    local_1b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
    local_1b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1b8.m_backend.exp = pnVar2[iVar5].m_backend.exp;
    local_1b8.m_backend.neg = pnVar2[iVar5].m_backend.neg;
    local_1b8.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
    local_1b8.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
    local_1f8.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
    local_1f8.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
    local_1f8.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
    local_1f8.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
    local_1f8.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
    local_1f8.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
    local_1f8.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
    local_1f8.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
    local_1f8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
    local_1f8.m_backend.exp = (this->m_origupper).m_backend.exp;
    local_1f8.m_backend.neg = (this->m_origupper).m_backend.neg;
    local_1f8.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
    local_1f8.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_68,this);
    bVar3 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1b8,&local_1f8,&local_68);
    if (!bVar3) {
LAB_002821d5:
      iVar5 = this->m_j;
      pnVar2 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2b8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
      local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
      local_2b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
      puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
      local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_2b8.m_backend.exp = pnVar2[iVar5].m_backend.exp;
      local_2b8.m_backend.neg = pnVar2[iVar5].m_backend.neg;
      local_2b8.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
      local_2b8.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
      local_2f8.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
      local_2f8.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
      local_2f8.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
      local_2f8.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
      local_2f8.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
      local_2f8.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
      local_2f8.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
      local_2f8.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
      local_2f8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
      local_2f8.m_backend.exp = (this->m_origupper).m_backend.exp;
      local_2f8.m_backend.neg = (this->m_origupper).m_backend.neg;
      local_2f8.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
      local_2f8.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
      bVar3 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b8,&local_2f8,&local_d8);
      iVar5 = this->m_j;
      if (bVar3) {
        VVar4 = ON_LOWER;
      }
      else {
        pnVar2 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_338.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
        local_338.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
        local_338.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
        local_338.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_338.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_338.m_backend.exp = pnVar2[iVar5].m_backend.exp;
        local_338.m_backend.neg = pnVar2[iVar5].m_backend.neg;
        local_338.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
        local_338.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
        local_378.m_backend.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
        local_378.m_backend.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
        local_378.m_backend.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
        local_378.m_backend.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
        local_378.m_backend.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
        local_378.m_backend.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
        local_378.m_backend.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
        local_378.m_backend.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
        local_378.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
        local_378.m_backend.exp = (this->m_origlower).m_backend.exp;
        local_378.m_backend.neg = (this->m_origlower).m_backend.neg;
        local_378.m_backend.fpclass = (this->m_origlower).m_backend.fpclass;
        local_378.m_backend.prec_elem = (this->m_origlower).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
        bVar3 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_338,&local_378,&local_110);
        if (!bVar3) {
          return;
        }
        iVar5 = this->m_j;
        VVar4 = ON_UPPER;
      }
      goto LAB_002823f5;
    }
    iVar5 = this->m_j;
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_238.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 8);
    local_238.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar5].m_backend.data;
    local_238.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar2[iVar5].m_backend.data._M_elems + 2);
    puVar1 = pnVar2[iVar5].m_backend.data._M_elems + 4;
    local_238.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_238.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_238.m_backend.exp = pnVar2[iVar5].m_backend.exp;
    local_238.m_backend.neg = pnVar2[iVar5].m_backend.neg;
    local_238.m_backend.fpclass = pnVar2[iVar5].m_backend.fpclass;
    local_238.m_backend.prec_elem = pnVar2[iVar5].m_backend.prec_elem;
    local_278.m_backend.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
    local_278.m_backend.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
    local_278.m_backend.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
    local_278.m_backend.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
    local_278.m_backend.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
    local_278.m_backend.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
    local_278.m_backend.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
    local_278.m_backend.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
    local_278.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
    local_278.m_backend.exp = (this->m_origlower).m_backend.exp;
    local_278.m_backend.neg = (this->m_origlower).m_backend.neg;
    local_278.m_backend.fpclass = (this->m_origlower).m_backend.fpclass;
    local_278.m_backend.prec_elem = (this->m_origlower).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
    bVar3 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_238,&local_278,&local_a0);
    if (!bVar3) goto LAB_002821d5;
  }
  iVar5 = this->m_j;
  VVar4 = BASIC;
LAB_002823f5:
  cStatus->data[iVar5] = VVar4;
  return;
}

Assistant:

void SPxMainSM<R>::TightenBoundsPS::execute(VectorBase<R>& x, VectorBase<R>&, VectorBase<R>&,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // basis:
   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(LT(x[m_j], m_origupper, this->feastol()) && GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
      else if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;

      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}